

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCache.h
# Opt level: O3

void __thiscall
Js::StringCache::Initialize(StringCache *this,ScriptContext *scriptContext,StaticType *staticString)

{
  Memory::Recycler::WBSetBit((char *)this);
  (this->scriptContext).ptr = scriptContext;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  Memory::Recycler::WBSetBit((char *)&this->stringTypeStatic);
  (this->stringTypeStatic).ptr = staticString;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->stringTypeStatic);
  return;
}

Assistant:

void Initialize(ScriptContext* scriptContext, StaticType* staticString)
    {
        this->scriptContext = scriptContext;
        this->stringTypeStatic = staticString;
    }